

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.h
# Opt level: O2

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::RenderBytes
          (ProtoWriter *this,StringPiece name,StringPiece value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined **local_30;
  undefined4 local_28;
  char *local_20;
  stringpiece_ssize_type local_18;
  undefined1 local_10;
  
  local_18 = value.length_;
  local_20 = value.ptr_;
  local_10 = (this->super_StructuredObjectWriter).super_ObjectWriter.use_strict_base64_decoding_;
  local_30 = &PTR__DataPiece_003e3c20;
  local_28 = 10;
  iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x12])
                    (this,name.ptr_,name.length_,&local_30);
  return (ProtoWriter *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ProtoWriter* RenderBytes(StringPiece name, StringPiece value) override {
    return RenderDataPiece(
        name, DataPiece(value, false, use_strict_base64_decoding()));
  }